

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O3

void __thiscall
duckdb::Binder::PrepareModifiers
          (Binder *this,OrderBinder *order_binder,QueryNode *statement,BoundQueryNode *result)

{
  Binder *this_00;
  pointer puVar1;
  Binder *this_01;
  pointer prVar2;
  undefined8 uVar3;
  OrderType OVar4;
  pointer pRVar5;
  DistinctModifier *pDVar6;
  element_type *peVar7;
  pointer pBVar8;
  ConstantExpression *this_02;
  reference pvVar9;
  pointer pPVar10;
  BaseExpression *this_03;
  StarExpression *pSVar11;
  pointer pBVar12;
  const_reference pvVar13;
  InternalException *this_04;
  ulong uVar14;
  pointer puVar15;
  SelectBindState *this_05;
  OrderBinder *pOVar16;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> _Var17;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> _Var18;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_06;
  OrderType order_type;
  OrderByNullType null_order;
  OrderType type;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  order_list;
  OrderType local_169;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> local_168;
  OrderByNullType local_159;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> local_158;
  OrderBinder local_150;
  undefined1 local_108 [16];
  undefined1 local_f8 [64];
  SelectBindState *local_b8;
  string local_b0;
  undefined1 local_90 [96];
  
  this_05 = (SelectBindState *)
            (statement->modifiers).
            super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = (SelectBindState *)
             (statement->modifiers).
             super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (this_05 != local_b8) {
    local_f8._56_8_ = &result->modifiers;
    this_00 = (Binder *)(local_90 + 0x20);
    local_150.query_component.field_2._M_allocated_capacity = (size_type)this;
    local_150.query_component.field_2._8_8_ = result;
    do {
      local_158._M_head_impl = (BoundDistinctModifier *)0x0;
      pRVar5 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
               ::operator->((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                             *)this_05);
      switch(pRVar5->type) {
      case LIMIT_MODIFIER:
        local_150.bind_state = this_05;
        pRVar5 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                 ::operator->((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                               *)this_05);
        ResultModifier::Cast<duckdb::LimitModifier>(pRVar5);
        BindLimit((Binder *)local_108,
                  (OrderBinder *)local_150.query_component.field_2._M_allocated_capacity,
                  (LimitModifier *)order_binder);
        break;
      case ORDER_MODIFIER:
        local_150.bind_state = this_05;
        pRVar5 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                 ::operator->((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                               *)this_05);
        local_150.binders.
        super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)ResultModifier::Cast<duckdb::OrderModifier>(pRVar5);
        peVar7 = (element_type *)operator_new(0x28);
        BoundOrderModifier::BoundOrderModifier((BoundOrderModifier *)peVar7);
        local_168._M_head_impl = (BoundDistinctModifier *)peVar7;
        local_150.binders.
        super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)DBConfig::GetConfig(*(ClientContext **)
                                           (local_150.query_component.field_2._M_allocated_capacity
                                           + 0x10));
        if ((long)(((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     *)((long)local_150.binders.
                              super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                              .
                              super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 0x10))->
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     *)((long)local_150.binders.
                              super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                              .
                              super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 0x10))->
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x10) {
          this_06 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     *)((long)local_150.binders.
                              super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                              .
                              super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 0x10);
          pvVar9 = vector<duckdb::OrderByNode,_true>::operator[]
                             ((vector<duckdb::OrderByNode,_true> *)this_06,0);
          pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(&pvVar9->expression);
          if ((pPVar10->super_BaseExpression).type != STAR) goto LAB_00c83f32;
          pvVar9 = vector<duckdb::OrderByNode,_true>::operator[]
                             ((vector<duckdb::OrderByNode,_true> *)this_06,0);
          this_03 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->(&pvVar9->expression)->super_BaseExpression;
          pSVar11 = BaseExpression::Cast<duckdb::StarExpression>(this_03);
          if ((((pSVar11->exclude_list)._M_h._M_element_count != 0) ||
              ((pSVar11->replace_list)._M_h._M_element_count != 0)) ||
             ((pSVar11->expr).
              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
              (ParsedExpression *)0x0)) goto LAB_00c83f32;
          local_150.bind_state = (SelectBindState *)this_06;
          pvVar9 = vector<duckdb::OrderByNode,_true>::operator[]
                             ((vector<duckdb::OrderByNode,_true> *)this_06,0);
          OVar4 = DBConfig::ResolveOrder
                            ((DBConfig *)
                             local_150.binders.
                             super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                             .
                             super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar9->type);
          local_169 = OVar4;
          pvVar9 = vector<duckdb::OrderByNode,_true>::operator[]
                             ((vector<duckdb::OrderByNode,_true> *)local_150.bind_state,0);
          local_159 = DBConfig::ResolveNullOrder
                                ((DBConfig *)
                                 local_150.binders.
                                 super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,OVar4,
                                 pvVar9->null_order);
          Value::Value((Value *)this_00,"ALL");
          peVar7 = (element_type *)operator_new(0x98);
          Value::Value((Value *)local_108,(Value *)this_00);
          BoundConstantExpression::BoundConstantExpression
                    ((BoundConstantExpression *)peVar7,(Value *)local_108);
          local_150.binders.
          super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar7;
          Value::~Value((Value *)local_108);
          Value::~Value((Value *)this_00);
          pBVar12 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                    ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                                  *)&local_168);
          ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
          emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                    ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                     &pBVar12->orders,&local_169,&local_159,
                     (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                      *)&local_150);
          _Var18._M_head_impl = local_158._M_head_impl;
          local_158._M_head_impl = local_168._M_head_impl;
          local_168._M_head_impl = (BoundDistinctModifier *)0x0;
          if ((element_type *)_Var18._M_head_impl != (element_type *)0x0) {
            (*(((Expression *)&(_Var18._M_head_impl)->super_BoundResultModifier)->
              super_BaseExpression)._vptr_BaseExpression[1])();
          }
          _Var17._M_head_impl =
               (BoundDistinctModifier *)
               local_150.binders.
               super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          _Var18._M_head_impl = local_168._M_head_impl;
          if ((element_type *)
              local_150.binders.
              super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
              ._M_impl.super__Vector_impl_data._M_start == (element_type *)0x0) goto LAB_00c840c2;
          goto LAB_00c840b7;
        }
LAB_00c83f32:
        pDVar6 = (DistinctModifier *)
                 (((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)((long)local_150.binders.
                             super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                             .
                             super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x10))->
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_150.binders.
        super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)(((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                         *)((long)local_150.binders.
                                  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                                  .
                                  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 0x10))->
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        if (pDVar6 != (DistinctModifier *)
                      local_150.binders.
                      super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_108._0_8_ = (element_type *)0x0;
            local_108._8_8_ = (element_type *)0x0;
            local_f8._0_8_ = (ClientContext *)0x0;
            pvVar13 = vector<std::reference_wrapper<duckdb::Binder>,_true>::operator[]
                                (&order_binder->binders,0);
            this_01 = pvVar13->_M_data;
            local_150.extra_list.ptr =
                 *(vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   **)&(pDVar6->super_ResultModifier).type;
            *(undefined8 *)&(pDVar6->super_ResultModifier).type = 0;
            ExpandStarExpression
                      (this_01,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)&local_150.extra_list,
                       (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)local_108);
            prVar2 = local_150.binders.
                     super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_150.extra_list.ptr !=
                (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 *)0x0) {
              (*(code *)*(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                          *)&((local_150.extra_list.ptr)->
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].
                             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                             ._M_t)();
            }
            local_150.extra_list.ptr =
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)0x0;
            OVar4 = DBConfig::ResolveOrder
                              ((DBConfig *)prVar2,
                               *(OrderType *)
                                &(((__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                                    *)&(pDVar6->super_ResultModifier)._vptr_ResultModifier)->
                                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                 )._M_t.
                                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                 _M_head_impl);
            local_150.binders.
            super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_150.binders.
                                   super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                                   .
                                   super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,OVar4);
            pOVar16 = (OrderBinder *)(ulong)OVar4;
            local_169 = DBConfig::ResolveNullOrder
                                  ((DBConfig *)prVar2,OVar4,
                                   *(OrderByNullType *)
                                    ((long)&(((__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                                               *)&(pDVar6->super_ResultModifier).
                                                  _vptr_ResultModifier)->
                                            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                            )._M_t.
                                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                            .
                                            super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>
                                            ._M_head_impl + 1));
            uVar3 = local_108._8_8_;
            for (peVar7 = (element_type *)local_108._0_8_; peVar7 != (element_type *)uVar3;
                peVar7 = (element_type *)
                         &(((Expression *)&peVar7->super_enable_shared_from_this<duckdb::Binder>)->
                          super_BaseExpression).type) {
              local_150.query_component._M_dataplus._M_p =
                   (pointer)(((Expression *)&peVar7->super_enable_shared_from_this<duckdb::Binder>)
                            ->super_BaseExpression)._vptr_BaseExpression;
              (((Expression *)&peVar7->super_enable_shared_from_this<duckdb::Binder>)->
              super_BaseExpression)._vptr_BaseExpression = (_func_int **)0x0;
              BindOrderExpression(this_00,pOVar16,
                                  (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)order_binder);
              if ((_func_int **)local_150.query_component._M_dataplus._M_p != (_func_int **)0x0) {
                (**(code **)(*(_func_int **)local_150.query_component._M_dataplus._M_p + 8))();
              }
              local_150.query_component._M_dataplus._M_p = (pointer)0x0;
              if ((_Hash_node_base *)local_90._32_8_ != (_Hash_node_base *)0x0) {
                pBVar12 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                          ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                                        *)&local_168);
                pOVar16 = &local_150;
                ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
                emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>
                            *)&pBVar12->orders,(OrderType *)pOVar16,&local_169,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)this_00);
                if ((_Hash_node_base *)local_90._32_8_ != (_Hash_node_base *)0x0) {
                  (*(code *)(*(_Hash_node_base **)local_90._32_8_)[1]._M_nxt)();
                }
              }
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)local_108);
            pDVar6 = (DistinctModifier *)&pDVar6->distinct_on_targets;
            this_05 = local_150.bind_state;
          } while (pDVar6 != (DistinctModifier *)
                             local_150.binders.
                             super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                             .
                             super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        pBVar12 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                  ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                                *)&local_168);
        _Var18._M_head_impl = local_168._M_head_impl;
        if ((pBVar12->orders).
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pBVar12->orders).
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_00c8409a;
        goto LAB_00c840c2;
      case DISTINCT_MODIFIER:
        local_150.bind_state = this_05;
        pRVar5 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                 ::operator->((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                               *)this_05);
        pDVar6 = ResultModifier::Cast<duckdb::DistinctModifier>(pRVar5);
        peVar7 = (element_type *)operator_new(0x28);
        BoundDistinctModifier::BoundDistinctModifier((BoundDistinctModifier *)peVar7);
        puVar15 = (pDVar6->distinct_on_targets).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (pDVar6->distinct_on_targets).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_168._M_head_impl = (BoundDistinctModifier *)peVar7;
        pBVar8 = unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                 ::operator->((unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                               *)&local_168);
        (pBVar8->super_BoundResultModifier).field_0x9 = puVar15 != puVar1;
        local_150.binders.
        super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pDVar6;
        if (((pDVar6->distinct_on_targets).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (pDVar6->distinct_on_targets).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (*(pointer *)(local_150.query_component.field_2._8_8_ + 0x30) !=
            (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)(local_150.query_component.field_2._8_8_ + 0x28))->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)) {
          local_150.binders.
          super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&pDVar6->distinct_on_targets
          ;
          uVar14 = 0;
          do {
            uVar14 = uVar14 + 1;
            Value::INTEGER((Value *)this_00,(int32_t)uVar14);
            this_02 = (ConstantExpression *)operator_new(0x78);
            Value::Value((Value *)local_108,(Value *)this_00);
            ConstantExpression::ConstantExpression(this_02,(Value *)local_108);
            Value::~Value((Value *)local_108);
            local_150.binders.
            super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)this_02;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)local_150.binders.
                          super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                          .
                          super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_150);
            if ((ConstantExpression *)
                local_150.binders.
                super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (ConstantExpression *)0x0) {
              (*(((ParsedExpression *)
                 &(local_150.binders.
                   super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_data)->super_BaseExpression).
                _vptr_BaseExpression[1])();
            }
            local_150.binders.
            super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            Value::~Value((Value *)this_00);
          } while (uVar14 < (ulong)((long)*(pointer *)
                                           (local_150.query_component.field_2._8_8_ + 0x30) -
                                    (long)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                             *)(local_150.query_component.field_2._8_8_ + 0x28))->
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        local_90._0_8_ = local_90 + 0x10;
        pOVar16 = (OrderBinder *)local_90;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)pOVar16,"DISTINCT ON","");
        OrderBinder::SetQueryComponent(order_binder,(string *)pOVar16);
        prVar2 = local_150.binders.
                 super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((pointer)local_90._0_8_ != (pointer)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_);
        }
        puVar1 = (((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)((long)prVar2 + 0x10))->
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar15 = (((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                          *)((long)prVar2 + 0x10))->
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar1;
            puVar15 = puVar15 + 1) {
          local_150.query_component._M_string_length =
               (size_type)
               (puVar15->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (puVar15->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          BindOrderExpression((Binder *)local_108,pOVar16,
                              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)order_binder);
          if ((ParsedExpression *)local_150.query_component._M_string_length !=
              (ParsedExpression *)0x0) {
            (**(code **)((long)((BaseExpression *)local_150.query_component._M_string_length)->
                               _vptr_BaseExpression + 8))();
          }
          local_150.query_component._M_string_length = 0;
          if ((element_type *)local_108._0_8_ != (element_type *)0x0) {
            pBVar8 = unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                     ::operator->((unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                                   *)&local_168);
            pOVar16 = (OrderBinder *)local_108;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&pBVar8->target_distincts,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)pOVar16);
            if ((element_type *)local_108._0_8_ != (element_type *)0x0) {
              (**(code **)(*(long *)local_108._0_8_ + 8))();
            }
          }
        }
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        OrderBinder::SetQueryComponent(order_binder,&local_b0);
        this_05 = local_150.bind_state;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
LAB_00c8409a:
        _Var17._M_head_impl = local_158._M_head_impl;
        local_158._M_head_impl = local_168._M_head_impl;
        local_168._M_head_impl = (BoundDistinctModifier *)0x0;
        if ((element_type *)_Var17._M_head_impl != (element_type *)0x0) {
LAB_00c840b7:
          (*(((Expression *)
             &((element_type *)_Var17._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>)
            ->super_BaseExpression)._vptr_BaseExpression[1])();
          _Var18._M_head_impl = local_168._M_head_impl;
          goto LAB_00c840c2;
        }
        goto LAB_00c840cd;
      case LIMIT_PERCENT_MODIFIER:
        local_150.bind_state = this_05;
        pRVar5 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                 ::operator->((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                               *)this_05);
        ResultModifier::Cast<duckdb::LimitPercentModifier>(pRVar5);
        BindLimitPercent((Binder *)local_108,
                         (OrderBinder *)local_150.query_component.field_2._M_allocated_capacity,
                         (LimitPercentModifier *)order_binder);
        break;
      default:
        this_04 = (InternalException *)__cxa_allocate_exception(0x10);
        local_108._0_8_ = local_f8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"Unsupported result modifier","");
        InternalException::InternalException(this_04,(string *)local_108);
        __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      _Var18._M_head_impl = local_158._M_head_impl;
      local_158._M_head_impl = (BoundDistinctModifier *)local_108._0_8_;
LAB_00c840c2:
      if ((element_type *)_Var18._M_head_impl != (element_type *)0x0) {
        (*(((Expression *)
           &((element_type *)_Var18._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>)->
          super_BaseExpression)._vptr_BaseExpression[1])();
      }
LAB_00c840cd:
      if (((element_type *)local_158._M_head_impl != (element_type *)0x0) &&
         (::std::
          vector<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>>>
                      *)local_f8._56_8_,
                     (unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                      *)&local_158), (element_type *)local_158._M_head_impl != (element_type *)0x0))
      {
        (*(((Expression *)&(local_158._M_head_impl)->super_BoundResultModifier)->
          super_BaseExpression)._vptr_BaseExpression[1])();
      }
      this_05 = (SelectBindState *)&(this_05->alias_map)._M_h._M_bucket_count;
    } while (this_05 != local_b8);
  }
  return;
}

Assistant:

void Binder::PrepareModifiers(OrderBinder &order_binder, QueryNode &statement, BoundQueryNode &result) {
	for (auto &mod : statement.modifiers) {
		unique_ptr<BoundResultModifier> bound_modifier;
		switch (mod->type) {
		case ResultModifierType::DISTINCT_MODIFIER: {
			auto &distinct = mod->Cast<DistinctModifier>();
			auto bound_distinct = make_uniq<BoundDistinctModifier>();
			bound_distinct->distinct_type =
			    distinct.distinct_on_targets.empty() ? DistinctType::DISTINCT : DistinctType::DISTINCT_ON;
			if (distinct.distinct_on_targets.empty()) {
				for (idx_t i = 0; i < result.names.size(); i++) {
					distinct.distinct_on_targets.push_back(
					    make_uniq<ConstantExpression>(Value::INTEGER(UnsafeNumericCast<int32_t>(1 + i))));
				}
			}
			order_binder.SetQueryComponent("DISTINCT ON");
			for (auto &distinct_on_target : distinct.distinct_on_targets) {
				auto expr = BindOrderExpression(order_binder, std::move(distinct_on_target));
				if (!expr) {
					continue;
				}
				bound_distinct->target_distincts.push_back(std::move(expr));
			}
			order_binder.SetQueryComponent();

			bound_modifier = std::move(bound_distinct);
			break;
		}
		case ResultModifierType::ORDER_MODIFIER: {

			auto &order = mod->Cast<OrderModifier>();
			auto bound_order = make_uniq<BoundOrderModifier>();
			auto &config = DBConfig::GetConfig(context);
			D_ASSERT(!order.orders.empty());
			auto &order_binders = order_binder.GetBinders();
			if (order.orders.size() == 1 && order.orders[0].expression->GetExpressionType() == ExpressionType::STAR) {
				auto &star = order.orders[0].expression->Cast<StarExpression>();
				if (star.exclude_list.empty() && star.replace_list.empty() && !star.expr) {
					// ORDER BY ALL
					// replace the order list with the all elements in the SELECT list
					auto order_type = config.ResolveOrder(order.orders[0].type);
					auto null_order = config.ResolveNullOrder(order_type, order.orders[0].null_order);
					auto constant_expr = make_uniq<BoundConstantExpression>(Value("ALL"));
					bound_order->orders.emplace_back(order_type, null_order, std::move(constant_expr));
					bound_modifier = std::move(bound_order);
					break;
				}
			}
#if 0
			// When this verification is enabled, replace ORDER BY x, y with ORDER BY create_sort_key(x, y)
			// note that we don't enable this during actual verification since it doesn't always work
			// e.g. it breaks EXPLAIN output on queries
			bool can_replace = true;
			for (auto &order_node : order.orders) {
				if (order_node.expression->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
					// we cannot replace the sort key when we order by literals (e.g. ORDER BY 1, 2`
					can_replace = false;
					break;
				}
			}
			if (!order_binder.HasExtraList()) {
				// we can only do the replacement when we can order by elements that are not in the selection list
				can_replace = false;
			}
			if (can_replace) {
				vector<unique_ptr<ParsedExpression>> sort_key_parameters;
				for (auto &order_node : order.orders) {
					sort_key_parameters.push_back(std::move(order_node.expression));
					auto type = config.ResolveOrder(order_node.type);
					auto null_order = config.ResolveNullOrder(type, order_node.null_order);
					string sort_param = EnumUtil::ToString(type) + " " + EnumUtil::ToString(null_order);
					sort_key_parameters.push_back(make_uniq<ConstantExpression>(Value(sort_param)));
				}
				order.orders.clear();
				auto create_sort_key = make_uniq<FunctionExpression>("create_sort_key", std::move(sort_key_parameters));
				order.orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_LAST, std::move(create_sort_key));
			}
#endif
			for (auto &order_node : order.orders) {
				vector<unique_ptr<ParsedExpression>> order_list;
				order_binders[0].get().ExpandStarExpression(std::move(order_node.expression), order_list);

				auto type = config.ResolveOrder(order_node.type);
				auto null_order = config.ResolveNullOrder(type, order_node.null_order);
				for (auto &order_expr : order_list) {
					auto bound_expr = BindOrderExpression(order_binder, std::move(order_expr));
					if (!bound_expr) {
						continue;
					}
					bound_order->orders.emplace_back(type, null_order, std::move(bound_expr));
				}
			}
			if (!bound_order->orders.empty()) {
				bound_modifier = std::move(bound_order);
			}
			break;
		}
		case ResultModifierType::LIMIT_MODIFIER:
			bound_modifier = BindLimit(order_binder, mod->Cast<LimitModifier>());
			break;
		case ResultModifierType::LIMIT_PERCENT_MODIFIER:
			bound_modifier = BindLimitPercent(order_binder, mod->Cast<LimitPercentModifier>());
			break;
		default:
			throw InternalException("Unsupported result modifier");
		}
		if (bound_modifier) {
			result.modifiers.push_back(std::move(bound_modifier));
		}
	}
}